

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshproxy.c
# Opt level: O2

void sshproxy_send_close(SshProxy *sp)

{
  int iVar1;
  _func_void_Plug_ptr_PlugCloseType_char_ptr *UNRECOVERED_JUMPTABLE;
  char *pcVar2;
  Plug *pPVar3;
  PlugCloseType PStack_10;
  
  if (sp->clientseat != (Seat *)0x0) {
    interactor_return_seat(sp->clientitr);
  }
  if (sp->conn_established == false) {
    (*sp->plug->vt->log)(sp->plug,PLUGLOG_CONNECT_FAILED,sp->addr,sp->port,sp->errmsg,0);
  }
  pcVar2 = sp->errmsg;
  if (pcVar2 == (char *)0x0) {
    if ((sp->conn_established == false) &&
       (iVar1 = (*sp->backend->vt->exitcode)(sp->backend), iVar1 == 0)) {
      pPVar3 = sp->plug;
      UNRECOVERED_JUMPTABLE = pPVar3->vt->closing;
      pcVar2 = "User aborted connection setup";
      PStack_10 = PLUGCLOSE_USER_ABORT;
    }
    else {
      pPVar3 = sp->plug;
      UNRECOVERED_JUMPTABLE = pPVar3->vt->closing;
      PStack_10 = PLUGCLOSE_NORMAL;
      pcVar2 = (char *)0x0;
    }
  }
  else {
    pPVar3 = sp->plug;
    UNRECOVERED_JUMPTABLE = pPVar3->vt->closing;
    PStack_10 = PLUGCLOSE_ERROR;
  }
  (*UNRECOVERED_JUMPTABLE)(pPVar3,PStack_10,pcVar2);
  return;
}

Assistant:

static void sshproxy_send_close(SshProxy *sp)
{
    if (sp->clientseat)
        interactor_return_seat(sp->clientitr);

    if (!sp->conn_established)
        plug_log(sp->plug, PLUGLOG_CONNECT_FAILED, sp->addr, sp->port,
                 sp->errmsg, 0);

    if (sp->errmsg)
        plug_closing_error(sp->plug, sp->errmsg);
    else if (!sp->conn_established && backend_exitcode(sp->backend) == 0)
        plug_closing_user_abort(sp->plug);
    else
        plug_closing_normal(sp->plug);
}